

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O2

bool anon_unknown.dwarf_2eb4cc6::EnableClmul(void)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  uVar5 = 0;
  piVar1 = (int *)cpuid_basic_info(0);
  iVar3 = piVar1[2];
  uVar4 = piVar1[3];
  if (*piVar1 != 0) {
    lVar2 = cpuid_Version_info(1);
    iVar3 = *(int *)(lVar2 + 8);
    uVar4 = *(uint *)(lVar2 + 0xc);
    uVar5 = (uVar4 & 2) >> 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return SUB41(uVar5,0);
  }
  __stack_chk_fail(piVar1[1],uVar5,iVar3,uVar4);
}

Assistant:

static inline bool EnableClmul()
{
#ifdef _MSC_VER
    int regs[4];
    __cpuid(regs, 1);
    return (regs[2] & 0x2);
#else
    uint32_t eax, ebx, ecx, edx;
    return (__get_cpuid(1, &eax, &ebx, &ecx, &edx) && (ecx & 0x2));
#endif
}